

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.h
# Opt level: O1

void llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call(void *Ptr)

{
  void *pvVar1;
  
  if (Ptr != (void *)0x0) {
    if (*(void **)((long)Ptr + 0xf0) != *(void **)((long)Ptr + 0xe8)) {
      free(*(void **)((long)Ptr + 0xf0));
    }
    if (*(void **)((long)Ptr + 0x50) != *(void **)((long)Ptr + 0x48)) {
      free(*(void **)((long)Ptr + 0x50));
    }
    pvVar1 = *(void **)((long)Ptr + 0x30);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)Ptr + 0x40) - (long)pvVar1);
    }
    if (*Ptr != (long *)((long)Ptr + 0x10)) {
      operator_delete(*Ptr,*(long *)((long)Ptr + 0x10) + 1);
    }
    operator_delete(Ptr,0x130);
    return;
  }
  return;
}

Assistant:

static void call(void *Ptr) { delete (T *)Ptr; }